

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O3

void xlsxioread_close(xlsxioreader handle)

{
  if (handle != (xlsxioreader)0x0) {
    unzClose(handle->zip);
    free(handle);
    return;
  }
  return;
}

Assistant:

DLL_EXPORT_XLSXIO void xlsxioread_close (xlsxioreader handle)
{
  if (handle) {
    //note: no need to call zip_source_free() after successful use in zip_open_from_source()
#ifdef USE_MINIZIP
    unzClose(handle->zip);
#else
    zip_close(handle->zip);
#endif
    free(handle);
  }
}